

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_secret_arg.cpp
# Opt level: O0

Map * add_room_4(RandomizerWorld *world,MapPalette *pal)

{
  MapPalette *this;
  Map *pMVar1;
  Map *pMVar2;
  MapLayout *layout;
  Blockset *value;
  Entity *pEVar3;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f1;
  Attributes local_f0;
  Entity *local_a0;
  Entity *npc_pockets;
  Attributes local_88;
  Entity *local_38;
  Entity *platform;
  Map *local_20;
  Map *map;
  MapPalette *pal_local;
  RandomizerWorld *world_local;
  
  map = (Map *)pal;
  pal_local = (MapPalette *)world;
  pMVar1 = World::map(&world->super_World,0x8d);
  local_20 = pMVar1;
  Flag::Flag((Flag *)&platform,0xc0,'\0');
  Map::visited_flag(pMVar1,(Flag *)&platform);
  pMVar1 = local_20;
  pMVar2 = World::map((World *)pal_local,0x8a);
  layout = Map::layout(pMVar2);
  Map::layout(pMVar1,layout);
  pMVar1 = local_20;
  pMVar2 = World::map((World *)pal_local,0x8a);
  value = Map::blockset(pMVar2);
  Map::blockset(pMVar1,value);
  Map::palette(local_20,(MapPalette *)map);
  Map::background_music(local_20,'\n');
  pEVar3 = (Entity *)operator_new(0x58);
  npc_pockets._3_1_ = 1;
  local_88.type_id = '\\';
  Position::Position(&local_88.position,'\x14','\x1d','\0',true,true,true);
  local_88.orientation = '\0';
  local_88.palette = '\0';
  local_88.speed = '\0';
  local_88.fightable = false;
  local_88.liftable = false;
  local_88.can_pass_through = false;
  local_88.appear_after_player_moved_away = false;
  local_88.gravity_immune = false;
  local_88.talkable = false;
  local_88.dialogue = '\0';
  local_88.behavior_id = 0;
  local_88.entity_to_use_tiles_from = (Entity *)0x0;
  local_88.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_88.mask_flags);
  Flag::Flag(&local_88.persistence_flag,0xff,0xff);
  local_88.flag_unknown_2_3 = false;
  local_88.flag_unknown_2_4 = false;
  local_88.flag_unknown_3_5 = false;
  Entity::Entity(pEVar3,&local_88);
  npc_pockets._3_1_ = 0;
  Entity::Attributes::~Attributes(&local_88);
  local_38 = pEVar3;
  Map::add_entity(local_20,pEVar3);
  pEVar3 = (Entity *)operator_new(0x58);
  local_f1 = 1;
  local_f0.type_id = 'z';
  Position::Position(&local_f0.position,'\x14','\x17','\0',false,false,false);
  local_f0.orientation = '\x03';
  local_f0.palette = '\x01';
  local_f0.speed = '\0';
  local_f0.fightable = false;
  local_f0.liftable = false;
  local_f0.can_pass_through = false;
  local_f0.appear_after_player_moved_away = false;
  local_f0.gravity_immune = false;
  local_f0.talkable = true;
  local_f0.dialogue = '\0';
  local_f0.behavior_id = 0;
  local_f0.entity_to_use_tiles_from = (Entity *)0x0;
  local_f0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector(&local_f0.mask_flags);
  Flag::Flag(&local_f0.persistence_flag,0xff,0xff);
  local_f0.flag_unknown_2_3 = false;
  local_f0.flag_unknown_2_4 = false;
  local_f0.flag_unknown_3_5 = false;
  Entity::Entity(pEVar3,&local_f0);
  local_f1 = 0;
  Entity::Attributes::~Attributes(&local_f0);
  local_a0 = pEVar3;
  Map::add_entity(local_20,pEVar3);
  this = pal_local;
  pEVar3 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "Pockets: Hello Nigel! I heard\nthere was a secret temple being\nuncovered here, so I came.\x1e\nThere are ancient writings on this\npillar, but I\'m no archeologist...\x03"
             ,&local_119);
  RandomizerWorld::add_custom_dialogue_raw((RandomizerWorld *)this,pEVar3,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  return local_20;
}

Assistant:

static Map* add_room_4(RandomizerWorld& world, MapPalette* pal)
{
    Map* map = world.map(MAP_SECRET_4);
    map->visited_flag(Flag(0xC0, 0));
    map->layout(world.map(MAP_KN_PALACE_138)->layout());
    map->blockset(world.map(MAP_KN_PALACE_138)->blockset());
    map->palette(pal);
    map->background_music(10);

    Entity* platform = new Entity({
        .type_id = ENTITY_LARGE_DARK_PLATFORM,
        .position = Position(0x14, 0x1D, 0x0, true, true, true),
        .palette = 0
    });
    map->add_entity(platform);

    Entity* npc_pockets = new Entity({
        .type_id = ENTITY_NPC_POCKETS,
        .position = Position(0x14, 0x17, 0x0, false, false, false),
        .orientation = ENTITY_ORIENTATION_NW,
        .palette = 1,
        .talkable = true
    });
    map->add_entity(npc_pockets);

    world.add_custom_dialogue_raw(npc_pockets, "Pockets: Hello Nigel! I heard\nthere was a secret temple being\nuncovered here, so I came.\x1e\n"
                                           "There are ancient writings on this\npillar, but I'm no archeologist...\x03");

    return map;
}